

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shake.cpp
# Opt level: O2

void __thiscall OpenMD::Shake::Shake(Shake *this,SimInfo *info)

{
  SimInfo *pSVar1;
  Globals *pGVar2;
  Parameter<double> *pPVar3;
  uint uVar4;
  ConstraintWriter *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  this->info_ = info;
  this->maxConsIteration_ = 10;
  this->consTolerance_ = 1e-06;
  this->doShake_ = false;
  (this->constraintOutputFile_)._M_dataplus._M_p = (pointer)&(this->constraintOutputFile_).field_2;
  (this->constraintOutputFile_)._M_string_length = 0;
  (this->constraintOutputFile_).field_2._M_local_buf[0] = '\0';
  this->currConstraintTime_ = 0.0;
  uVar4 = SimInfo::getNGlobalConstraints(info);
  if (uVar4 == 0) {
    if ((this->doShake_ & 1U) == 0) {
      return;
    }
  }
  else {
    this->doShake_ = true;
  }
  pSVar1 = this->info_;
  pGVar2 = pSVar1->simParams_;
  this->currentSnapshot_ = pSVar1->sman_->currentSnapshot_;
  pPVar3 = &pGVar2->ConstraintTime;
  if ((pGVar2->ConstraintTime).super_ParameterBase.empty_ != false) {
    pPVar3 = &pGVar2->StatusTime;
  }
  this->constraintTime_ = pPVar3->data_;
  std::__cxx11::string::string((string *)&local_40,(string *)&pSVar1->finalConfigFileName_);
  getPrefix(&local_60,&local_40);
  std::operator+(&local_80,&local_60,".constraintForces");
  std::__cxx11::string::operator=((string *)&this->constraintOutputFile_,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  this_00 = (ConstraintWriter *)operator_new(0x208);
  pSVar1 = this->info_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,(this->constraintOutputFile_)._M_dataplus._M_p,
             (allocator<char> *)&local_60);
  ConstraintWriter::ConstraintWriter(this_00,pSVar1,&local_80);
  this->constraintWriter_ = this_00;
  std::__cxx11::string::~string((string *)&local_80);
  if (this->constraintWriter_ == (ConstraintWriter *)0x0) {
    builtin_strncpy(painCave.errMsg,"Failed to create ConstraintWriter\n",0x23);
    painCave.isFatal = 1;
    simError();
  }
  return;
}

Assistant:

Shake::Shake(SimInfo* info) :
      info_(info), maxConsIteration_(10), consTolerance_(1.0e-6),
      doShake_(false), currConstraintTime_(0.0) {
    if (info_->getNGlobalConstraints() > 0) doShake_ = true;

    if (!doShake_) return;

    Globals* simParams = info_->getSimParams();

    currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();
    if (simParams->haveConstraintTime()) {
      constraintTime_ = simParams->getConstraintTime();
    } else {
      constraintTime_ = simParams->getStatusTime();
    }

    constraintOutputFile_ =
        getPrefix(info_->getFinalConfigFileName()) + ".constraintForces";

    // create ConstraintWriter
    constraintWriter_ =
        new ConstraintWriter(info_, constraintOutputFile_.c_str());

    if (!constraintWriter_) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Failed to create ConstraintWriter\n");
      painCave.isFatal = 1;
      simError();
    }
  }